

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_WriteArrayBuffer(BCWriterState *s,JSValue obj)

{
  uint32_t *puVar1;
  int iVar2;
  DynBuf *s_00;
  
  puVar1 = *(uint32_t **)((long)obj.u.ptr + 0x30);
  if ((char)puVar1[1] == '\0') {
    s_00 = &s->dbuf;
    dbuf_putc(s_00,'\x11');
    dbuf_put_leb128(s_00,*puVar1);
    dbuf_put(s_00,*(uint8_t **)(puVar1 + 2),(long)(int)*puVar1);
    iVar2 = 0;
  }
  else {
    JS_ThrowTypeError(s->ctx,"ArrayBuffer is detached",obj.tag);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int JS_WriteArrayBuffer(BCWriterState *s, JSValueConst obj)
{
    JSObject *p = JS_VALUE_GET_OBJ(obj);
    JSArrayBuffer *abuf = p->u.array_buffer;
    if (abuf->detached) {
        JS_ThrowTypeErrorDetachedArrayBuffer(s->ctx);
        return -1;
    }
    bc_put_u8(s, BC_TAG_ARRAY_BUFFER);
    bc_put_leb128(s, abuf->byte_length);
    dbuf_put(&s->dbuf, abuf->data, abuf->byte_length);
    return 0;
}